

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O3

ChQuaternion<double> *
chrono::Q_from_Euler123(ChQuaternion<double> *__return_storage_ptr__,ChVector<double> *ang)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 extraout_var [56];
  
  dVar1 = cos(ang->m_data[2] * 0.5);
  dVar2 = sin(ang->m_data[2] * 0.5);
  dVar3 = cos(ang->m_data[0] * 0.5);
  dVar4 = sin(ang->m_data[0] * 0.5);
  dVar5 = cos(ang->m_data[1] * 0.5);
  auVar7._0_8_ = sin(ang->m_data[1] * 0.5);
  auVar7._8_56_ = extraout_var;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar5;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1 * dVar3;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar4 * dVar2 * dVar5;
  auVar9 = vfmadd231sd_fma(auVar9,auVar7._0_16_,auVar8);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar4 * dVar2 * auVar7._0_8_;
  auVar8 = vfmadd231sd_fma(auVar10,auVar8,auVar14);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar4 * dVar1;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = auVar7._0_8_ * dVar2 * dVar3;
  auVar10 = vfmsub231sd_fma(auVar12,auVar11,auVar14);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar7._0_8_ * dVar4 * dVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar2 * dVar3;
  auVar6 = vfmsub231sd_fma(auVar6,auVar13,auVar14);
  __return_storage_ptr__->m_data[0] = auVar8._0_8_;
  __return_storage_ptr__->m_data[1] = auVar10._0_8_;
  __return_storage_ptr__->m_data[2] = auVar9._0_8_;
  __return_storage_ptr__->m_data[3] = auVar6._0_8_;
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> Q_from_Euler123(const ChVector<double>& ang) {
	ChQuaternion<double> q;
    double t0 = cos(ang.z() * 0.5);
	double t1 = sin(ang.z() * 0.5);
	double t2 = cos(ang.x() * 0.5);
	double t3 = sin(ang.x() * 0.5);
	double t4 = cos(ang.y() * 0.5);
	double t5 = sin(ang.y() * 0.5);

	q.e0() = t0 * t2 * t4 + t1 * t3 * t5;
	q.e1() = t0 * t3 * t4 - t1 * t2 * t5;
	q.e2() = t0 * t2 * t5 + t1 * t3 * t4;
	q.e3() = t1 * t2 * t4 - t0 * t3 * t5;
	
	return q;
}